

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

int __thiscall
TPZMatrix<std::complex<double>_>::Subst_LForward
          (TPZMatrix<std::complex<double>_> *this,TPZFMatrix<std::complex<double>_> *B)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int64_t c;
  long lVar2;
  int64_t i;
  long lVar3;
  int64_t r;
  long lVar4;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double in_XMM1_Qa;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  undefined1 local_40 [16];
  
  lVar4 = (B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
  iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])();
  if ((lVar4 != CONCAT44(extraout_var,iVar1)) || ((this->super_TPZBaseMatrix).fDecomposed != '\x04')
     ) {
    Error("TPZMatrix::Subst_LForward incompatible dimensions\n",(char *)0x0);
  }
  lVar4 = 0;
  while( true ) {
    iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
    if (CONCAT44(extraout_var_00,iVar1) <= lVar4) break;
    for (lVar2 = 0; lVar2 < (B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol;
        lVar2 = lVar2 + 1) {
      local_68 = 0.0;
      dStack_60 = 0.0;
      for (lVar3 = 0; lVar4 != lVar3; lVar3 = lVar3 + 1) {
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar4,lVar3);
        local_58 = extraout_XMM0_Qa;
        dStack_50 = in_XMM1_Qa;
        (*(B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
          _vptr_TPZSavable[0x24])(B,lVar3,lVar2);
        local_40._8_8_ = in_XMM1_Qa;
        std::operator*((complex<double> *)&local_58,(complex<double> *)local_40);
        local_68 = local_68 + extraout_XMM0_Qa_00;
        dStack_60 = dStack_60 + in_XMM1_Qa;
        in_XMM1_Qa = local_68;
      }
      (*(B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
        _vptr_TPZSavable[0x24])(B,lVar4,lVar2);
      local_58 = extraout_XMM0_Qa_01 - local_68;
      dStack_50 = in_XMM1_Qa - dStack_60;
      (*(B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
        _vptr_TPZSavable[0x23])(B,lVar4,lVar2,(complex<double> *)&local_58);
    }
    lVar4 = lVar4 + 1;
  }
  return 1;
}

Assistant:

int TPZMatrix<TVar>::Subst_LForward( TPZFMatrix<TVar> *B ) const {
	if ( (B->Rows() != Dim()) || !fDecomposed || fDecomposed != ELDLt) {
		Error("TPZMatrix::Subst_LForward incompatible dimensions\n");
	}
    for ( int64_t r = 0; r < Dim(); r++ ) {
        for ( int64_t c = 0; c < B->Cols();  c++ )    {
            // Faz sum = SOMA( A[r,i] * B[i,c] ); i = 0, ..., r-1.
            //
            TVar sum = 0.0;
            for ( int64_t i = 0; i < r; i++ ) sum += GetVal(r, i) * B->GetVal(i, c);
			
            // Faz B[r,c] = (B[r,c] - sum) / A[r,r].
            //
            B->PutVal( r, c, B->GetVal(r, c) - sum );
        }
    }
    return( 1 );
}